

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryFinally(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int n;
  CallFlags e;
  BOOL BVar5;
  ScriptContext *pSVar6;
  ThreadContext *pTVar7;
  Var *values;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptLibrary *this;
  RecyclableObject *object;
  JavascriptLibrary *this_00;
  JavascriptFunction *defaultConstructor;
  RecyclableObject *instanceObj;
  RecyclableObject *pRVar10;
  JavascriptMethod p_Var11;
  CallInfo local_e0;
  CallInfo local_d8;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  RecyclableObject *func;
  Var funcVar;
  Var catchFinally;
  Var thenFinally;
  RecyclableObject *constructor;
  RecyclableObject *promise;
  JavascriptLibrary *library;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  pTVar7 = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar7,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x38a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x38b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,
             L"Promise.prototype.finally",&stack0x00000000);
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,0);
    BVar5 = Js::JavascriptOperators::IsObject(pvVar9);
    if (BVar5 != 0) {
      this = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,0);
      object = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
      this_00 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
      defaultConstructor =
           JavascriptLibraryBase::GetPromiseConstructor(&this_00->super_JavascriptLibraryBase);
      instanceObj = Js::JavascriptOperators::SpeciesConstructor
                              (object,defaultConstructor,(ScriptContext *)__tag.entry.next);
      bVar4 = Js::JavascriptOperators::IsConstructor(instanceObj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                    ,0x39c,"(JavascriptOperators::IsConstructor(constructor))",
                                    "JavascriptOperators::IsConstructor(constructor)");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
        catchFinally = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
        funcVar = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      else {
        pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
        bVar4 = JavascriptConversion::IsCallable(pvVar9);
        if (bVar4) {
          pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
          pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
          catchFinally = JavascriptLibrary::CreatePromiseThenFinallyFunction
                                   (this,EntryThenFinallyFunction,pRVar10,instanceObj,false);
          pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
          pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
          funcVar = JavascriptLibrary::CreatePromiseThenFinallyFunction
                              (this,EntryThenFinallyFunction,pRVar10,instanceObj,true);
        }
        else {
          catchFinally = Arguments::operator[]((Arguments *)&scriptContext,1);
          funcVar = Arguments::operator[]((Arguments *)&scriptContext,1);
        }
      }
      if ((catchFinally == (Var)0x0) || (funcVar == (Var)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                    ,0x3be,"(thenFinally != nullptr && catchFinally != nullptr)",
                                    "thenFinally != nullptr && catchFinally != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pvVar9 = Js::JavascriptOperators::GetProperty
                         (object,0x169,(ScriptContext *)__tag.entry.next,(PropertyValueInfo *)0x0);
      bVar4 = JavascriptConversion::IsCallable(pvVar9);
      if (bVar4) {
        autoReentrancyHandler._8_8_ = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
        pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar7);
        pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar7);
        pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::AssertJsReentrancy(pTVar7);
        uVar2 = autoReentrancyHandler._8_8_;
        p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
        CheckIsExecutable((RecyclableObject *)uVar2,p_Var11);
        p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
        uVar2 = autoReentrancyHandler._8_8_;
        CallInfo::CallInfo(&local_d8,CallFlags_Value,3);
        uVar3 = autoReentrancyHandler._8_8_;
        CallInfo::CallInfo(&local_e0,CallFlags_Value,3);
        pvVar9 = (*p_Var11)((RecyclableObject *)uVar2,(CallInfo)uVar3,local_d8,0,0,0,0,local_e0,
                            object,catchFinally,funcVar);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70)
        ;
        return pvVar9;
      }
      JavascriptError::ThrowTypeError
                ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"Promise.prototype.finally");
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec41,L"Promise.prototype.finally");
}

Assistant:

Var JavascriptPromise::EntryFinally(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.prototype.finally"));
        // 1. Let promise be the this value
        // 2. If Type(promise) is not Object, throw a TypeError exception
        if (args.Info.Count < 1 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.prototype.finally"));
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        RecyclableObject* promise = UnsafeVarTo<RecyclableObject>(args[0]);
        // 3. Let C be ? SpeciesConstructor(promise, %Promise%).
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(promise, scriptContext->GetLibrary()->GetPromiseConstructor(), scriptContext);
        // 4. Assert IsConstructor(C)
        Assert(JavascriptOperators::IsConstructor(constructor));

        // 5. If IsCallable(onFinally) is false
        //   a. Let thenFinally be onFinally
        //   b. Let catchFinally be onFinally
        // 6. Else,
        //   a. Let thenFinally be a new built-in function object as defined in ThenFinally Function.
        //   b. Let catchFinally be a new built-in function object as defined in CatchFinally Function.
        //   c. Set thenFinally and catchFinally's [[Constructor]] internal slots to C.
        //   d. Set thenFinally and catchFinally's [[OnFinally]] internal slots to onFinally.

        Var thenFinally = nullptr;
        Var catchFinally = nullptr;

        if (args.Info.Count > 1)
        {
            if (JavascriptConversion::IsCallable(args[1]))
            {
                //note to avoid duplicating code the ThenFinallyFunction works as both thenFinally and catchFinally using a flag
                thenFinally = library->CreatePromiseThenFinallyFunction(EntryThenFinallyFunction, VarTo<RecyclableObject>(args[1]), constructor, false);
                catchFinally = library->CreatePromiseThenFinallyFunction(EntryThenFinallyFunction, VarTo<RecyclableObject>(args[1]), constructor, true);
            }
            else
            {
                thenFinally = args[1];
                catchFinally = args[1];
            }
        }
        else
        {
            thenFinally = library->GetUndefined();
            catchFinally = library->GetUndefined();
        }

        Assert(thenFinally != nullptr && catchFinally != nullptr);

        // 7. Return ? Invoke(promise, "then", << thenFinally, catchFinally >>).
        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);
        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.finally"));
        }
        RecyclableObject* func = UnsafeVarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                func, Js::CallInfo(CallFlags_Value, 3),
                promise,
                thenFinally,
                catchFinally);
        }
        END_SAFE_REENTRANT_CALL
    }